

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsMemoryStressCase.cpp
# Opt level: O2

void __thiscall deqp::gls::MemObjectAllocator::allocateBuffer(MemObjectAllocator *this,Random *rnd)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  GLenum GVar4;
  int size;
  pointer data;
  ulong uVar5;
  deUint32 buffer;
  
  buffer = 0;
  iVar3 = de::Random::getInt(rnd,(this->m_config).minBufferSize,(this->m_config).maxBufferSize);
  glwGenBuffers(1,&buffer);
  GVar4 = glwGetError();
  if (GVar4 != 0) {
    this->m_result = RESULT_GEN_BUFFERS_FAILED;
    goto LAB_00444a25;
  }
  glwBindBuffer(0x8892,buffer);
  GVar4 = glwGetError();
  if (GVar4 == 0) {
    uVar5 = (long)(this->m_buffers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(this->m_buffers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    if ((uVar5 & 0x1fc) == 0) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
                (&this->m_buffers,((long)uVar5 >> 2) + 0x80);
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&this->m_buffers,&buffer);
    if ((this->m_config).useDummyData == true) {
      data = (this->m_dummyData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    }
    else {
      data = (pointer)0x0;
    }
    glwBufferData(0x8892,(long)iVar3,data,0x88e8);
    GVar4 = glwGetError();
    if (GVar4 != 0) {
      this->m_result = RESULT_BUFFER_DATA_FAILED;
      goto LAB_00444a25;
    }
    if ((this->m_config).write == true) {
      glwBufferSubData(0x8892,0,1,
                       (this->m_dummyData).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start);
    }
    GVar4 = glwGetError();
    if (GVar4 != 0) {
      this->m_result = RESULT_BUFFER_SUB_DATA_FAILED;
      goto LAB_00444a25;
    }
    if ((this->m_config).use == true) {
      BufferRenderer::render(&this->m_bufferRenderer,buffer,size);
    }
    glwBindBuffer(0x8892,0);
    GVar4 = glwGetError();
    if (GVar4 == 0) {
      uVar1 = this->m_objectCount;
      uVar2 = this->m_bytesRequired;
      this->m_objectCount = uVar1 + 1;
      this->m_bytesRequired = iVar3 + uVar2;
      return;
    }
  }
  this->m_result = RESULT_BIND_BUFFER_FAILED;
LAB_00444a25:
  this->m_glError = GVar4;
  return;
}

Assistant:

void MemObjectAllocator::allocateBuffer (de::Random& rnd)
{
	const int	vectorBlockSize = 128;
	deUint32	buffer			= 0;
	deUint32	error			= 0;
	int			size			= rnd.getInt(m_config.minBufferSize, m_config.maxBufferSize);

	glGenBuffers(1, &buffer);
	error = glGetError();
	if (error != 0)
	{
		m_result	= RESULT_GEN_BUFFERS_FAILED;
		m_glError	= error;
		return;
	}

	glBindBuffer(GL_ARRAY_BUFFER, buffer);
	error = glGetError();
	if (error != 0)
	{
		m_result	= RESULT_BIND_BUFFER_FAILED;
		m_glError	= error;
		return;
	}

	if (m_buffers.size() % vectorBlockSize == 0)
		m_buffers.reserve(m_buffers.size() + vectorBlockSize);

	m_buffers.push_back(buffer);

	if (m_config.useDummyData)
	{
		DE_ASSERT((int)m_dummyData.size() >= size);
		glBufferData(GL_ARRAY_BUFFER, size, &(m_dummyData[0]), GL_DYNAMIC_DRAW);
	}
	else
		glBufferData(GL_ARRAY_BUFFER, size, NULL, GL_DYNAMIC_DRAW);

	error = glGetError();
	if (error != 0)
	{
		m_result	= RESULT_BUFFER_DATA_FAILED;
		m_glError	= error;
		return;
	}

	if (m_config.write)
		glBufferSubData(GL_ARRAY_BUFFER, 0, 1, &(m_dummyData[0]));

	error = glGetError();
	if (error != 0)
	{
		m_result	= RESULT_BUFFER_SUB_DATA_FAILED;
		m_glError	= error;
		return;
	}

	if (m_config.use)
	{
		try
		{
			m_bufferRenderer.render(buffer, size);
		}
		catch (const glu::Error& err)
		{
			m_result	= RESULT_RENDER_FAILED;
			m_glError	= err.getError();
			return;
		}
		catch (const glu::OutOfMemoryError&)
		{
			m_result	= RESULT_RENDER_FAILED;
			m_glError	= GL_OUT_OF_MEMORY;
			return;
		}
	}

	glBindBuffer(GL_ARRAY_BUFFER, 0);
	error = glGetError();
	if (error != 0)
	{
		m_result	= RESULT_BIND_BUFFER_FAILED;
		m_glError	= error;
		return;
	}

	m_objectCount++;
	m_bytesRequired += size;
}